

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
* __thiscall
nlohmann::json_abi_v3_11_2::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
::operator=(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *other)

{
  value_t vVar1;
  json_value jVar2;
  
  assert_invariant(other,true);
  vVar1 = (this->m_data).m_type;
  (this->m_data).m_type = (other->m_data).m_type;
  (other->m_data).m_type = vVar1;
  jVar2 = (this->m_data).m_value;
  (this->m_data).m_value = (other->m_data).m_value;
  (other->m_data).m_value = jVar2;
  assert_invariant(this,true);
  return this;
}

Assistant:

basic_json& operator=(basic_json other) noexcept (
        std::is_nothrow_move_constructible<value_t>::value&&
        std::is_nothrow_move_assignable<value_t>::value&&
        std::is_nothrow_move_constructible<json_value>::value&&
        std::is_nothrow_move_assignable<json_value>::value&&
        std::is_nothrow_move_assignable<json_base_class_t>::value
    )
    {
        // check that passed value is valid
        other.assert_invariant();

        using std::swap;
        swap(m_data.m_type, other.m_data.m_type);
        swap(m_data.m_value, other.m_data.m_value);
        json_base_class_t::operator=(std::move(other));

        set_parents();
        assert_invariant();
        return *this;
    }